

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkTargetIDList.cpp
# Opt level: O2

void __thiscall LinkTargetIDList::printLinkTargetIdList(LinkTargetIDList *this)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_60;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "____________________LinkTargetIdList______________________");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"IDListSize:                         ");
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60,&this->IDListSize);
  iVar1 = Utils::lenTwoBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_60);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  poVar2 = std::operator<<(poVar2," bytes");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_60);
  poVar2 = std::operator<<((ostream *)&std::cout,"IDList:                             ");
  std::endl<char,std::char_traits<char>>(poVar2);
  lVar3 = 0;
  for (uVar4 = 0;
      uVar4 < (ulong)(((long)(this->IDList).
                             super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->IDList).
                            super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                            ._M_impl.super__Vector_impl_data._M_start) / 0x30); uVar4 = uVar4 + 1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"   ItemID ");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)uVar4 + 1);
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"       ItemIDSize:                  ");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->IDList).
                         super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                         ._M_impl.super__Vector_impl_data._M_start)->ItemIDSize).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
               lVar3));
    iVar1 = Utils::lenTwoBytes((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    poVar2 = std::operator<<(poVar2," bytes");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_90);
    std::operator<<((ostream *)&std::cout,"       Data:                        ");
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               ((long)&(((this->IDList).
                         super__Vector_base<LinkTargetIDList::ItemIDList,_std::allocator<LinkTargetIDList::ItemIDList>_>
                         ._M_impl.super__Vector_impl_data._M_start)->Data).
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl +
               lVar3));
    Utils::parseItemData((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
    lVar3 = lVar3 + 0x30;
  }
  std::operator<<((ostream *)&std::cout,"   TerminalID:                      ");
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78,&this->TerminalID);
  Utils::print_vec((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_78);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_78);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "_________________________________________________________");
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void LinkTargetIDList::printLinkTargetIdList() {
    cout <<"____________________LinkTargetIdList______________________" << endl;
    cout << "IDListSize:                         " << dec << Utils::lenTwoBytes(IDListSize) << " bytes" << endl;
    cout << "IDList:                             " << endl ;
    for(int i = 0; i < IDList.size(); ++i){
        cout << "   ItemID " << dec << i + 1 << endl;
        cout << "       ItemIDSize:                  " << dec << Utils::lenTwoBytes(IDList[i].ItemIDSize) << " bytes" << endl;
        cout << "       Data:                        "; Utils::parseItemData(IDList[i].Data);
    }
    cout << "   TerminalID:                      "; Utils::print_vec(TerminalID);
    cout << "_________________________________________________________" << endl;
}